

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_curveproxy.cpp
# Opt level: O1

bool __thiscall
ON_CurveProxy::Evaluate
          (ON_CurveProxy *this,double t,int der_count,int v_stride,double *v,int side,int *hint)

{
  ON_Curve *pOVar1;
  bool bVar2;
  char cVar3;
  uint uVar5;
  double *pdVar6;
  ulong uVar7;
  double dVar8;
  int iVar4;
  
  dVar8 = ON_Interval::NormalizedParameterAt(&this->m_this_domain,t);
  if (2.3283064365386963e-10 <= ABS(dVar8)) {
    if (ABS(1.0 - dVar8) < 2.3283064365386963e-10) {
      uVar5 = -side;
      if (0 < side) {
        uVar5 = side;
      }
      side = uVar5 < 2 | 0xfffffffe;
    }
  }
  else {
    uVar5 = -side;
    if (0 < side) {
      uVar5 = side;
    }
    side = 2 - (uVar5 < 2);
  }
  if (side == 0) {
    side = 0;
  }
  else {
    uVar5 = -side;
    if ((this->m_bReversed != false) ||
       (bVar2 = ON_Interval::operator!=(&this->m_real_curve_domain,&this->m_this_domain),
       uVar5 = side, bVar2)) {
      side = uVar5;
      if (side == 0xffffffff) {
        side = 0xfffffffe;
      }
      else if (side == 1) {
        side = 2;
      }
    }
  }
  RealCurveParameter(this,t);
  pOVar1 = this->m_real_curve;
  if (pOVar1 == (ON_Curve *)0x0) {
    cVar3 = '\0';
  }
  else {
    iVar4 = (*(pOVar1->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x3b])
                      (pOVar1,der_count,(ulong)(uint)v_stride,v,(ulong)(uint)side,hint);
    cVar3 = (char)iVar4;
  }
  if (((cVar3 != '\0') && (this->m_bReversed == true)) &&
     (uVar5 = (*(this->m_real_curve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x18])(),
     0 < der_count)) {
    pdVar6 = v + v_stride;
    iVar4 = 1;
    do {
      if (0 < (int)uVar5) {
        uVar7 = 0;
        do {
          pdVar6[uVar7] = -pdVar6[uVar7];
          uVar7 = uVar7 + 1;
        } while (uVar5 != uVar7);
      }
      iVar4 = iVar4 + 2;
      pdVar6 = pdVar6 + (long)v_stride * 2;
    } while (iVar4 <= der_count);
  }
  return (bool)cVar3;
}

Assistant:

bool 
ON_CurveProxy::Evaluate( // returns false if unable to evaluate
       double t,       // evaluation parameter
       int der_count,  // number of derivatives (>=0)
       int v_stride,   // v[] array stride (>=Dimension())
       double* v,      // v[] array of length stride*(ndir+1)
       int side,       // optional - determines which side to evaluate from
                       //         0 = default
                       //      <  0 to evaluate from below, 
                       //      >  0 to evaluate from above
       int* hint       // optional - evaluation hint (int) used to speed
                       //            repeated evaluations
       ) const
{
  // When the proxy domain is a proper subdomain of the 
  // real curve and we are evaluating at the end, we
  // need to be certain we are getting the values
  // from the active part of the curve.
  double normt = m_this_domain.NormalizedParameterAt(t);
  if( fabs( normt )<ON_ZERO_TOLERANCE)
    side = ( std::abs(side) <= 1) ? 1 : 2;
  else if( fabs(1.0 - normt)<ON_ZERO_TOLERANCE)
    side = ( std::abs(side) <= 1) ? -1 : -2;
  
  if ( 0 != side )
  {
    if ( m_bReversed )
    {
      side = -side;
    }
    if (m_bReversed || m_real_curve_domain != m_this_domain )
    {
      // 9 November 2010 Dale Lear - ON_TuneupEvaluationParameter fix
      //  If we have to adjust the evaluation parameter for the 
      //  real curve and the evaluation side was specified, then
      //  set side to +2 or -2 to trigger the use of
      //  ON_TuneupEvaluationParameter() when it matters.
      if ( -1 == side )
        side = -2;
      else if ( 1 == side )
        side = 2;
    }
  }

  double r = RealCurveParameter(t);
  bool rc = ( m_real_curve ) 
          ? m_real_curve->Evaluate( r,der_count,v_stride,v,side,hint) 
          : false;
  if ( rc && m_bReversed ) 
  {
    // negate odd derivatives
    const int dim = m_real_curve->Dimension();
    int di, i;
    for ( di = 1; di <= der_count; di+=2 ) 
    {
      v += v_stride;
      for ( i = 0; i < dim; i++ ) 
      {
        v[i] = -v[i];
      }
      v += v_stride;
    }
  }
  return rc;
}